

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::save_load_online_state<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,gd *g,stringstream *msg,
               sparse_parameters *weights)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  size_t sVar7;
  weight *pwVar8;
  float *pfVar9;
  char *pcVar10;
  byte in_DL;
  int __c;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  long in_RDI;
  long in_R8;
  long in_R9;
  iterator iVar11;
  sparse_parameters *in_stack_00000008;
  iterator v_1;
  size_t i_1;
  weight *v;
  uint32_t stride;
  weight buff [4];
  stringstream __msg;
  size_t brw;
  uint32_t old_i;
  uint64_t i;
  uint64_t length;
  sparse_iterator<float> *in_stack_fffffffffffffd18;
  sparse_parameters *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  int plineNumber;
  char *in_stack_fffffffffffffd48;
  vw_exception *in_stack_fffffffffffffd50;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_260;
  uint32_t local_258;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_250;
  uint32_t local_248;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_240;
  uint32_t local_238;
  undefined1 in_stack_fffffffffffffdcf;
  stringstream *in_stack_fffffffffffffdd0;
  ulong uVar12;
  size_t in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  io_buf *in_stack_fffffffffffffde8;
  stringstream local_1d0 [16];
  stringstream local_1c0 [176];
  char *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  io_buf *in_stack_ffffffffffffff08;
  size_t local_48;
  
  uVar1 = *(undefined4 *)(in_RDI + 0x50);
  if ((in_DL & 1) == 0) {
    iVar11 = sparse_parameters::begin(in_stack_fffffffffffffd20);
    local_250._M_cur =
         (__node_type *)
         iVar11._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_248 = iVar11._stride;
    local_240._M_cur = local_250._M_cur;
    local_238 = local_248;
    while( true ) {
      iVar11 = sparse_parameters::end(in_stack_fffffffffffffd20);
      local_260._M_cur =
           (__node_type *)
           iVar11._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_258 = iVar11._stride;
      __s = &local_260;
      bVar2 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffd20,
                         in_stack_fffffffffffffd18);
      if (!bVar2) break;
      pfVar9 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fdda5);
      if ((*pfVar9 != 0.0) || (NAN(*pfVar9))) {
        pcVar10 = sparse_iterator<float>::index
                            ((sparse_iterator<float> *)&local_240,(char *)__s,__c);
        uVar3 = sparse_parameters::stride_shift(in_stack_00000008);
        std::ostream::operator<<((void *)(in_R9 + 0x10),(ulong)pcVar10 >> ((byte)uVar3 & 0x3f));
        if (*(uint *)(in_RDI + 0x50) < 0x1f) {
          bin_text_write_fixed
                    (in_stack_fffffffffffffde8,
                     (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (bool)in_stack_fffffffffffffdcf);
        }
        else {
          bin_text_write_fixed
                    (in_stack_fffffffffffffde8,
                     (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (bool)in_stack_fffffffffffffdcf);
        }
        if ((in_R8 == 0) ||
           (((*(byte *)(in_R8 + 0x59) & 1) == 0 && ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          poVar5 = std::operator<<((ostream *)(in_R9 + 0x10),":");
          pfVar9 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fdeef);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar9);
          std::operator<<(poVar5,"\n");
          sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fdf26);
          bin_text_write_fixed
                    (in_stack_fffffffffffffde8,
                     (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (bool)in_stack_fffffffffffffdcf);
        }
        else if ((((*(byte *)(in_R8 + 0x59) & 1) == 0) || ((*(byte *)(in_R8 + 0x58) & 1) != 0)) &&
                (((*(byte *)(in_R8 + 0x59) & 1) != 0 || ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          in_stack_fffffffffffffd20 =
               (sparse_parameters *)std::operator<<((ostream *)(in_R9 + 0x10),":");
          pfVar9 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fe099);
          poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd20,*pfVar9);
          poVar5 = std::operator<<(poVar5," ");
          pfVar9 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fe0c8);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar9[1]);
          poVar5 = std::operator<<(poVar5," ");
          pfVar9 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fe0f8);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar9[2]);
          std::operator<<(poVar5,"\n");
          sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fe130);
          bin_text_write_fixed
                    (in_stack_fffffffffffffde8,
                     (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (bool)in_stack_fffffffffffffdcf);
        }
        else {
          poVar5 = std::operator<<((ostream *)(in_R9 + 0x10),":");
          pfVar9 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fdfcc);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar9);
          poVar5 = std::operator<<(poVar5," ");
          pfVar9 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fdffb);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar9[1]);
          std::operator<<(poVar5,"\n");
          sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1fe033);
          bin_text_write_fixed
                    (in_stack_fffffffffffffde8,
                     (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (bool)in_stack_fffffffffffffdcf);
        }
      }
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffd20);
    }
  }
  else {
    do {
      if (*(uint *)(in_RDI + 0x50) < 0x1f) {
        local_48 = io_buf::bin_read_fixed
                             (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      }
      else {
        local_48 = io_buf::bin_read_fixed
                             (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      }
      plineNumber = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
      if (local_48 != 0) {
        if (1L << ((byte)uVar1 & 0x3f) == 0) {
          std::__cxx11::stringstream::stringstream(local_1d0);
          poVar5 = std::operator<<((ostream *)(local_1d0 + 0x10),
                                   "Model content is corrupted, weight vector index ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
          poVar5 = std::operator<<(poVar5," must be less than total vector length ");
          std::ostream::operator<<(poVar5,0);
          uVar6 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,plineNumber,
                     in_stack_fffffffffffffd38);
          __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        memset(&stack0xfffffffffffffde8,0,0x10);
        if ((in_R8 == 0) ||
           (((*(byte *)(in_R8 + 0x59) & 1) == 0 && ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          sVar7 = io_buf::bin_read_fixed
                            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        }
        else if ((((*(byte *)(in_R8 + 0x59) & 1) == 0) || ((*(byte *)(in_R8 + 0x58) & 1) != 0)) &&
                (((*(byte *)(in_R8 + 0x59) & 1) != 0 || ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          sVar7 = io_buf::bin_read_fixed
                            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        }
        else {
          sVar7 = io_buf::bin_read_fixed
                            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        }
        local_48 = sVar7 + local_48;
        uVar3 = sparse_parameters::stride_shift(in_stack_00000008);
        uVar4 = 1 << ((byte)uVar3 & 0x1f);
        pwVar8 = sparse_parameters::strided_index
                           (in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18);
        for (uVar12 = 0; uVar12 < uVar4; uVar12 = uVar12 + 1) {
          pwVar8[uVar12] = *(weight *)(&stack0xfffffffffffffde8 + uVar12 * 4);
        }
      }
    } while (local_48 != 0);
  }
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g, stringstream& msg, T& weights)
{
  uint64_t length = (uint64_t)1 << all.num_bits;

  uint64_t i = 0;
  uint32_t old_i = 0;
  size_t brw = 1;

  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight buff[4] = {0, 0, 0, 0};
        if (g == NULL || (!g->adaptive && !g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]), "");
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 2, "");
        else  // adaptive and normalized
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 3, "");
        uint32_t stride = 1 << weights.stride_shift();
        weight* v = &weights.strided_index(i);
        for (size_t i = 0; i < stride; i++) v[i] = buff[i];
      }
    } while (brw > 0);
  else  // write binary or text
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        msg << i;
        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        if (g == nullptr || (!g->adaptive && !g->normalized))
        {
          msg << ":" << *v << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
        }
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
        {
          // either adaptive or normalized
          msg << ":" << *v << " " << (&(*v))[1] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 2 * sizeof(*v), msg, text);
        }
        else
        {
          // adaptive and normalized
          msg << ":" << *v << " " << (&(*v))[1] << " " << (&(*v))[2] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 3 * sizeof(*v), msg, text);
        }
      }
}